

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyplg_ext_insert(lyd_node *parent,lyd_node *first)

{
  lyd_node *plVar1;
  ly_ctx *local_30;
  lyd_node *iter;
  lyd_node *first_local;
  lyd_node *parent_local;
  
  if (parent == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent",
           "lyplg_ext_insert");
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (first == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","first","lyplg_ext_insert"
          );
    parent_local._4_4_ = LY_EINVAL;
  }
  else if (first->parent == (lyd_node_inner *)0x0) {
    if (first->prev->next == (lyd_node *)0x0) {
      if ((parent->schema == (lysc_node *)0x0) || ((parent->schema->nodetype & 0x711) != 0)) {
        iter = first;
        if ((first->schema == (lysc_node *)0x0) || ((first->schema->flags & 0x100) == 0)) {
          while (iter != (lyd_node *)0x0) {
            plVar1 = iter->next;
            lyd_unlink(iter);
            lyd_insert_node(parent,(lyd_node **)0x0,iter,1);
            iter = plVar1;
          }
          parent_local._4_4_ = LY_SUCCESS;
        }
        else {
          if (parent->schema == (lysc_node *)0x0) {
            local_30 = (ly_ctx *)parent[2].schema;
          }
          else {
            local_30 = parent->schema->module->ctx;
          }
          ly_log(local_30,LY_LLERR,LY_EINVAL,"Cannot insert key \"%s\".",first->schema->name);
          parent_local._4_4_ = LY_EINVAL;
        }
      }
      else {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
               "!parent->schema || (parent->schema->nodetype & (0x0001|0x0010|0x0100|0x0200|0x0400))"
               ,"lyplg_ext_insert");
        parent_local._4_4_ = LY_EINVAL;
      }
    }
    else {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!first->prev->next",
             "lyplg_ext_insert");
      parent_local._4_4_ = LY_EINVAL;
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!first->parent",
           "lyplg_ext_insert");
    parent_local._4_4_ = LY_EINVAL;
  }
  return parent_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_insert(struct lyd_node *parent, struct lyd_node *first)
{
    struct lyd_node *iter;

    LY_CHECK_ARG_RET(NULL, parent, first, !first->parent, !first->prev->next,
            !parent->schema || (parent->schema->nodetype & LYD_NODE_INNER), LY_EINVAL);

    if (first->schema && (first->schema->flags & LYS_KEY)) {
        LOGERR(LYD_CTX(parent), LY_EINVAL, "Cannot insert key \"%s\".", first->schema->name);
        return LY_EINVAL;
    }

    while (first) {
        iter = first->next;
        lyd_unlink(first);
        lyd_insert_node(parent, NULL, first, LYD_INSERT_NODE_LAST);
        first = iter;
    }
    return LY_SUCCESS;
}